

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_iterator.hpp
# Opt level: O1

void __thiscall
boost::spirit::classic::
position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>
::position_iterator<char_const*>
          (position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>
           *this,file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>
                 *begin,
          file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_> *end
          ,char *fileName)

{
  allocator<char> local_41;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(char **)(this + 0x10) = (begin->super_type).m_iterator.m_curChar;
  shared_ptr<boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>::mapping>::operator=
            ((shared_ptr<boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>::mapping> *
             )this,(shared_ptr<boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>::mapping>
                    *)begin);
  *(undefined4 *)(this + 0x18) = 4;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(char **)(this + 0x30) = (end->super_type).m_iterator.m_curChar;
  shared_ptr<boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>::mapping>::operator=
            ((shared_ptr<boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>::mapping> *
             )(this + 0x20),
             (shared_ptr<boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>::mapping> *
             )end);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,fileName,&local_41);
  *(position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>
    **)(this + 0x38) = this + 0x48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 0x38),local_40,local_38 + (long)local_40);
  *(undefined8 *)(this + 0x58) = 0x100000001;
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  this[0x60] = (position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>
                )((begin->super_type).m_iterator.m_curChar == (end->super_type).m_iterator.m_curChar
                 );
  return;
}

Assistant:

position_iterator(
        const ForwardIteratorT& begin,
        const ForwardIteratorT& end,
        FileNameT fileName)
    :   base_t(begin), _end(end), _pos(PositionT(fileName)),
        _isend(begin == end)
    {}